

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::Command::Match(Command *this,EitherFlag *flag)

{
  Base *this_00;
  bool bVar1;
  int iVar2;
  Options OVar3;
  uint uVar4;
  undefined4 extraout_var;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_01;
  reference ppBVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Command *local_60;
  FlagBase *res_1;
  Base *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range3;
  FlagBase *res;
  EitherFlag *flag_local;
  Command *this_local;
  
  if (this->selectedCommand == (Command *)0x0) {
    if (this->subparser == (Subparser *)0x0) {
      uVar4 = (*(this->super_Group).super_Base._vptr_Base[2])();
      if ((uVar4 & 1) == 0) {
        local_60 = (Command *)0x0;
      }
      else {
        local_60 = (Command *)Group::Match(&this->super_Group,flag);
      }
      this_local = local_60;
    }
    else {
      iVar2 = (*(this->subparser->super_Group).super_Base._vptr_Base[7])(this->subparser,flag);
      this_local = (Command *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  else {
    iVar2 = (*(this->selectedCommand->super_Group).super_Base._vptr_Base[7])
                      (this->selectedCommand,flag);
    this_local = (Command *)CONCAT44(extraout_var,iVar2);
    if (this_local == (Command *)0x0) {
      this_01 = Group::Children(&this->super_Group);
      __end3 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_01);
      child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                         *)&child), bVar1) {
        ppBVar5 = __gnu_cxx::
                  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                  ::operator*(&__end3);
        this_00 = *ppBVar5;
        OVar3 = Base::GetOptions(this_00);
        OVar3 = operator&(OVar3,Global);
        if (OVar3 != None) {
          iVar2 = (*this_00->_vptr_Base[7])(this_00,flag);
          if ((FlagBase *)CONCAT44(extraout_var_00,iVar2) != (FlagBase *)0x0) {
            return (FlagBase *)CONCAT44(extraout_var_00,iVar2);
          }
        }
        __gnu_cxx::
        __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
        ::operator++(&__end3);
      }
      this_local = (Command *)0x0;
    }
  }
  return (FlagBase *)this_local;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->Match(flag))
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->Match(flag))
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->Match(flag);
                }

                return Matched() ? Group::Match(flag) : nullptr;
            }